

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O0

char * __thiscall
google::protobuf::FieldOptions::_InternalParse(FieldOptions *this,char *ptr,ParseContext *ctx)

{
  bool bVar1;
  uint uVar2;
  Arena *ptr_00;
  uint64 uVar3;
  UninterpretedOption *pUVar4;
  ParseContext *in_RDX;
  UninterpretedOption *in_RSI;
  FieldOptions *in_RDI;
  uint64 val_1;
  uint64 val;
  uint32 tag;
  Arena *arena;
  HasBits has_bits;
  char **in_stack_ffffffffffffff68;
  ParseContext *in_stack_ffffffffffffff70;
  ParseContext *in_stack_ffffffffffffff78;
  UninterpretedOption *in_stack_ffffffffffffff80;
  ParseContext *in_stack_ffffffffffffff88;
  ParseContext *in_stack_ffffffffffffff90;
  InternalMetadataWithArena *in_stack_ffffffffffffff98;
  ParseContext *in_stack_ffffffffffffffb0;
  ParseContext *pPVar5;
  InternalMetadataWithArena *in_stack_ffffffffffffffb8;
  InternalMetadataWithArena *pIVar6;
  undefined4 in_stack_ffffffffffffffc0;
  uint in_stack_ffffffffffffffc4;
  uint64 in_stack_ffffffffffffffd0;
  UninterpretedOption *local_20;
  
  memset(&stack0xffffffffffffffd4,0,4);
  ptr_00 = GetArenaNoVirtual((FieldOptions *)in_stack_ffffffffffffff70);
  local_20 = in_RSI;
LAB_0050c116:
  bVar1 = internal::ParseContext::Done(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
  if (((bVar1 ^ 0xffU) & 1) == 0) goto LAB_0050c5fe;
  local_20 = (UninterpretedOption *)
             internal::ReadTag((char *)in_stack_ffffffffffffff98,(uint32 *)in_stack_ffffffffffffff90
                               ,(uint32)((ulong)in_stack_ffffffffffffff88 >> 0x20));
  if (local_20 == (UninterpretedOption *)0x0) goto LAB_0050c61e;
  uVar2 = in_stack_ffffffffffffffc4 >> 3;
  if (uVar2 == 1) {
    if ((in_stack_ffffffffffffffc4 & 0xff) == 8) {
      in_stack_ffffffffffffffb8 =
           (InternalMetadataWithArena *)internal::ReadVarint((char **)in_stack_ffffffffffffff70);
      if (local_20 == (UninterpretedOption *)0x0) goto LAB_0050c61e;
      bVar1 = FieldOptions_CType_IsValid((int)in_stack_ffffffffffffffb8);
      if (bVar1) {
        _internal_set_ctype(in_RDI,(FieldOptions_CType)in_stack_ffffffffffffffb8);
      }
      else {
        pIVar6 = in_stack_ffffffffffffffb8;
        mutable_unknown_fields((FieldOptions *)in_stack_ffffffffffffff70);
        internal::WriteVarint
                  ((uint32)((ulong)in_stack_ffffffffffffff70 >> 0x20),
                   (uint64)in_stack_ffffffffffffff68,(UnknownFieldSet *)0x50c258);
        in_stack_ffffffffffffff98 = in_stack_ffffffffffffffb8;
        in_stack_ffffffffffffffb8 = pIVar6;
      }
      goto LAB_0050c116;
    }
  }
  else {
    pUVar4 = local_20;
    if (uVar2 == 2) {
      if ((in_stack_ffffffffffffffc4 & 0xff) != 0x10) goto LAB_0050c52a;
      _Internal::set_has_packed((HasBits *)&stack0xffffffffffffffd4);
      uVar3 = internal::ReadVarint((char **)in_stack_ffffffffffffff70);
      in_RDI->packed_ = uVar3 != 0;
      goto joined_r0x0050c2b1;
    }
    if (uVar2 == 3) {
      if ((in_stack_ffffffffffffffc4 & 0xff) == 0x18) {
        _Internal::set_has_deprecated((HasBits *)&stack0xffffffffffffffd4);
        uVar3 = internal::ReadVarint((char **)in_stack_ffffffffffffff70);
        in_RDI->deprecated_ = uVar3 != 0;
        goto joined_r0x0050c2b1;
      }
    }
    else if (uVar2 == 5) {
      if ((in_stack_ffffffffffffffc4 & 0xff) == 0x28) {
        _Internal::set_has_lazy((HasBits *)&stack0xffffffffffffffd4);
        uVar3 = internal::ReadVarint((char **)in_stack_ffffffffffffff70);
        in_RDI->lazy_ = uVar3 != 0;
        goto joined_r0x0050c2b1;
      }
    }
    else if (uVar2 == 6) {
      if ((in_stack_ffffffffffffffc4 & 0xff) == 0x30) {
        in_stack_ffffffffffffffb0 =
             (ParseContext *)internal::ReadVarint((char **)in_stack_ffffffffffffff70);
        if (local_20 == (UninterpretedOption *)0x0) goto LAB_0050c61e;
        bVar1 = FieldOptions_JSType_IsValid((int)in_stack_ffffffffffffffb0);
        if (bVar1) {
          _internal_set_jstype(in_RDI,(FieldOptions_JSType)in_stack_ffffffffffffffb0);
        }
        else {
          pPVar5 = in_stack_ffffffffffffffb0;
          mutable_unknown_fields((FieldOptions *)in_stack_ffffffffffffff70);
          internal::WriteVarint
                    ((uint32)((ulong)in_stack_ffffffffffffff70 >> 0x20),
                     (uint64)in_stack_ffffffffffffff68,(UnknownFieldSet *)0x50c415);
          in_stack_ffffffffffffff90 = in_stack_ffffffffffffffb0;
          in_stack_ffffffffffffffb0 = pPVar5;
        }
        goto LAB_0050c116;
      }
    }
    else {
      if (uVar2 != 10) {
        if ((uVar2 != 999) || ((in_stack_ffffffffffffffc4 & 0xff) != 0x3a)) goto LAB_0050c52a;
        do {
          in_stack_ffffffffffffff88 = in_RDX;
          in_RDX = in_stack_ffffffffffffff88;
          _internal_add_uninterpreted_option((FieldOptions *)0x50c4cd);
          local_20 = (UninterpretedOption *)
                     internal::ParseContext::ParseMessage<google::protobuf::UninterpretedOption>
                               (in_stack_ffffffffffffff88,in_stack_ffffffffffffff80,
                                (char *)in_stack_ffffffffffffff78);
          if (local_20 == (UninterpretedOption *)0x0) goto LAB_0050c61e;
          bVar1 = internal::EpsCopyInputStream::DataAvailable
                            (&in_RDX->super_EpsCopyInputStream,(char *)local_20);
        } while ((bVar1) && (bVar1 = internal::ExpectTag<7994u>((char *)local_20), bVar1));
        goto LAB_0050c116;
      }
      if ((in_stack_ffffffffffffffc4 & 0xff) == 0x50) {
        _Internal::set_has_weak((HasBits *)&stack0xffffffffffffffd4);
        uVar3 = internal::ReadVarint((char **)in_stack_ffffffffffffff70);
        in_RDI->weak_ = uVar3 != 0;
        goto joined_r0x0050c2b1;
      }
    }
  }
LAB_0050c52a:
  if (((in_stack_ffffffffffffffc4 & 7) == 4) || (in_stack_ffffffffffffffc4 == 0)) {
    internal::EpsCopyInputStream::SetLastTag
              (&in_RDX->super_EpsCopyInputStream,in_stack_ffffffffffffffc4);
    goto LAB_0050c5fe;
  }
  if (in_stack_ffffffffffffffc4 < 8000) {
    pUVar4 = (UninterpretedOption *)
             internal::UnknownFieldParse
                       ((uint32)((ulong)in_stack_ffffffffffffff90 >> 0x20),
                        (InternalMetadataWithArena *)in_stack_ffffffffffffff88,
                        (char *)in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  }
  else {
    in_stack_ffffffffffffff70 = (ParseContext *)&in_RDI->_extensions_;
    in_stack_ffffffffffffff78 = (ParseContext *)(ulong)in_stack_ffffffffffffffc4;
    internal_default_instance();
    pUVar4 = (UninterpretedOption *)
             internal::ExtensionSet::ParseField
                       ((ExtensionSet *)in_RDX,in_stack_ffffffffffffffd0,(char *)ptr_00,
                        (Message *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                        in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
    in_stack_ffffffffffffff80 = local_20;
  }
joined_r0x0050c2b1:
  local_20 = pUVar4;
  if (local_20 == (UninterpretedOption *)0x0) {
LAB_0050c61e:
    local_20 = (UninterpretedOption *)0x0;
LAB_0050c5fe:
    internal::HasBits<1UL>::Or(&in_RDI->_has_bits_,(HasBits<1UL> *)&stack0xffffffffffffffd4);
    return (char *)local_20;
  }
  goto LAB_0050c116;
}

Assistant:

const char* FieldOptions::_InternalParse(const char* ptr, ::PROTOBUF_NAMESPACE_ID::internal::ParseContext* ctx) {
#define CHK_(x) if (PROTOBUF_PREDICT_FALSE(!(x))) goto failure
  _Internal::HasBits has_bits{};
  ::PROTOBUF_NAMESPACE_ID::Arena* arena = GetArenaNoVirtual(); (void)arena;
  while (!ctx->Done(&ptr)) {
    ::PROTOBUF_NAMESPACE_ID::uint32 tag;
    ptr = ::PROTOBUF_NAMESPACE_ID::internal::ReadTag(ptr, &tag);
    CHK_(ptr);
    switch (tag >> 3) {
      // optional .google.protobuf.FieldOptions.CType ctype = 1 [default = STRING];
      case 1:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 8)) {
          ::PROTOBUF_NAMESPACE_ID::uint64 val = ::PROTOBUF_NAMESPACE_ID::internal::ReadVarint(&ptr);
          CHK_(ptr);
          if (PROTOBUF_PREDICT_TRUE(PROTOBUF_NAMESPACE_ID::FieldOptions_CType_IsValid(val))) {
            _internal_set_ctype(static_cast<PROTOBUF_NAMESPACE_ID::FieldOptions_CType>(val));
          } else {
            ::PROTOBUF_NAMESPACE_ID::internal::WriteVarint(1, val, mutable_unknown_fields());
          }
        } else goto handle_unusual;
        continue;
      // optional bool packed = 2;
      case 2:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 16)) {
          _Internal::set_has_packed(&has_bits);
          packed_ = ::PROTOBUF_NAMESPACE_ID::internal::ReadVarint(&ptr);
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      // optional bool deprecated = 3 [default = false];
      case 3:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 24)) {
          _Internal::set_has_deprecated(&has_bits);
          deprecated_ = ::PROTOBUF_NAMESPACE_ID::internal::ReadVarint(&ptr);
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      // optional bool lazy = 5 [default = false];
      case 5:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 40)) {
          _Internal::set_has_lazy(&has_bits);
          lazy_ = ::PROTOBUF_NAMESPACE_ID::internal::ReadVarint(&ptr);
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      // optional .google.protobuf.FieldOptions.JSType jstype = 6 [default = JS_NORMAL];
      case 6:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 48)) {
          ::PROTOBUF_NAMESPACE_ID::uint64 val = ::PROTOBUF_NAMESPACE_ID::internal::ReadVarint(&ptr);
          CHK_(ptr);
          if (PROTOBUF_PREDICT_TRUE(PROTOBUF_NAMESPACE_ID::FieldOptions_JSType_IsValid(val))) {
            _internal_set_jstype(static_cast<PROTOBUF_NAMESPACE_ID::FieldOptions_JSType>(val));
          } else {
            ::PROTOBUF_NAMESPACE_ID::internal::WriteVarint(6, val, mutable_unknown_fields());
          }
        } else goto handle_unusual;
        continue;
      // optional bool weak = 10 [default = false];
      case 10:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 80)) {
          _Internal::set_has_weak(&has_bits);
          weak_ = ::PROTOBUF_NAMESPACE_ID::internal::ReadVarint(&ptr);
          CHK_(ptr);
        } else goto handle_unusual;
        continue;
      // repeated .google.protobuf.UninterpretedOption uninterpreted_option = 999;
      case 999:
        if (PROTOBUF_PREDICT_TRUE(static_cast<::PROTOBUF_NAMESPACE_ID::uint8>(tag) == 58)) {
          ptr -= 2;
          do {
            ptr += 2;
            ptr = ctx->ParseMessage(_internal_add_uninterpreted_option(), ptr);
            CHK_(ptr);
            if (!ctx->DataAvailable(ptr)) break;
          } while (::PROTOBUF_NAMESPACE_ID::internal::ExpectTag<7994>(ptr));
        } else goto handle_unusual;
        continue;
      default: {
      handle_unusual:
        if ((tag & 7) == 4 || tag == 0) {
          ctx->SetLastTag(tag);
          goto success;
        }
      if ((8000u <= tag)) {
        ptr = _extensions_.ParseField(tag, ptr,
            internal_default_instance(), &_internal_metadata_, ctx);
        CHK_(ptr != nullptr);
        continue;
      }
        ptr = UnknownFieldParse(tag, &_internal_metadata_, ptr, ctx);
        CHK_(ptr != nullptr);
        continue;
      }
    }  // switch
  }  // while
success:
  _has_bits_.Or(has_bits);
  return ptr;
failure:
  ptr = nullptr;
  goto success;
#undef CHK_
}